

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall google::protobuf::internal::DynamicMapField::~DynamicMapField(DynamicMapField *this)

{
  bool bVar1;
  reference pvVar2;
  value_type *kv;
  iterator __end2;
  iterator __begin2;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *__range2;
  DynamicMapField *this_local;
  
  (this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
  super_MapFieldBase._vptr_MapFieldBase = (_func_int **)&PTR__DynamicMapField_008ec280;
  if ((this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>)
      .super_MapFieldBase.arena_ == (Arena *)0x0) {
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::begin
              ((iterator *)&__end2.it_.bucket_index_,&this->map_);
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::end((iterator *)&kv,&this->map_);
    while (bVar1 = protobuf::operator!=((iterator *)&__end2.it_.bucket_index_,(iterator *)&kv),
          bVar1) {
      pvVar2 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::iterator::operator*
                         ((iterator *)&__end2.it_.bucket_index_);
      MapValueRef::DeleteData((MapValueRef *)(pvVar2 + 0x28));
      Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::iterator::operator++
                ((iterator *)&__end2.it_.bucket_index_);
    }
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::clear(&this->map_);
  }
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::~Map(&this->map_);
  TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>::
  ~TypeDefinedMapFieldBase
            (&this->
              super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
            );
  return;
}

Assistant:

DynamicMapField::~DynamicMapField() {
  if (arena_ != nullptr) return;
  // DynamicMapField owns map values. Need to delete them before clearing the
  // map.
  for (auto& kv : map_) {
    kv.second.DeleteData();
  }
  map_.clear();
}